

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int64_suite::fail_array32_int64_missing_four(void)

{
  value_type input [9];
  decoder decoder;
  undefined4 local_50;
  value local_4c;
  uchar local_48 [16];
  decoder local_38;
  
  local_38.input._M_str = local_48;
  local_48[0] = 0xce;
  local_48[1] = '\b';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\x11';
  local_48[6] = '\"';
  local_48[7] = '3';
  local_48[8] = 0x44;
  local_38.input._M_len = 9;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_4c = local_38.current.code;
  local_50 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xbab,"void compact_int64_suite::fail_array32_int64_missing_four()",&local_4c,
             &local_50);
  return;
}

Assistant:

void fail_array32_int64_missing_four()
{
    const value_type input[] = { token::code::array32_int64, 0x08, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}